

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

int pix_version(char *irafheader)

{
  int iVar1;
  char *in_RDI;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = irafncmp((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                   in_stack_ffffffffffffffec);
  if (iVar1 == 0) {
    iVar1 = 1;
  }
  else {
    iVar1 = strncmp(in_RDI,"impv2",5);
    if (iVar1 == 0) {
      iVar1 = 2;
    }
    else {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int pix_version (
    char *irafheader)   /* IRAF image header from file */
{

    /* Check pixel file header magic word */
    if (irafncmp (irafheader, "impix", 5) != 0) {
	if (strncmp (irafheader, "impv2", 5) != 0)
	    return (0);
	else
	    return (2);
	}
    else
	return (1);
}